

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.hpp
# Opt level: O0

ResourceData * __thiscall
Diligent::DeviceObjectArchive::GetResourceData
          (DeviceObjectArchive *this,ResourceType Type,char *Name)

{
  mapped_type *pmVar1;
  NamedResourceKey local_40;
  undefined1 local_21;
  char *pcStack_20;
  bool MakeCopy;
  char *Name_local;
  DeviceObjectArchive *pDStack_10;
  ResourceType Type_local;
  DeviceObjectArchive *this_local;
  
  local_21 = 1;
  pcStack_20 = Name;
  Name_local._4_4_ = Type;
  pDStack_10 = this;
  NamedResourceKey::NamedResourceKey(&local_40,Type,Name,true);
  pmVar1 = std::
           unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
           ::operator[](&this->m_NamedResources,&local_40);
  NamedResourceKey::~NamedResourceKey(&local_40);
  return pmVar1;
}

Assistant:

ResourceData& GetResourceData(ResourceType Type, const char* Name) noexcept
    {
        constexpr auto MakeCopy = true;
        return m_NamedResources[NamedResourceKey{Type, Name, MakeCopy}];
    }